

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearConstraint.cpp
# Opt level: O2

void __thiscall
iDynTree::optimalcontrol::LinearConstraint::LinearConstraintImplementation::
LinearConstraintImplementation(LinearConstraintImplementation *this,size_t size)

{
  this->constrainsState = false;
  this->constrainsControl = false;
  (this->stateConstraintMatrix).
  super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->stateConstraintMatrix).
  super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->controlConstraintMatrix).
  super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->controlConstraintMatrix).
  super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iDynTree::VectorDynSize::VectorDynSize(&this->stateConstraintsBuffer,size & 0xffffffff);
  iDynTree::VectorDynSize::VectorDynSize(&this->controlConstraintsBuffer,size & 0xffffffff);
  this->hasStateSparsity = false;
  this->hasControlSparsity = false;
  SparsityStructure::SparsityStructure(&this->stateSparsity);
  SparsityStructure::SparsityStructure(&this->controlSparsity);
  iDynTree::VectorDynSize::zero();
  iDynTree::VectorDynSize::zero();
  return;
}

Assistant:

LinearConstraintImplementation(size_t size)
                : constrainsState(false)
                , constrainsControl(false)
                , stateConstraintsBuffer(static_cast<unsigned int>(size))
                , controlConstraintsBuffer(static_cast<unsigned int>(size))
                , hasStateSparsity(false)
                , hasControlSparsity(false)
            {
                stateConstraintsBuffer.zero();
                controlConstraintsBuffer.zero();
            }